

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::ContentEncoding::SetEncryptionID(ContentEncoding *this,uint8_t *id,uint64_t length)

{
  void *pvVar1;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  bool local_1;
  
  if ((in_RSI == (void *)0x0) || (in_RDX == 0)) {
    local_1 = false;
  }
  else {
    if (*(void **)(in_RDI + 8) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 8));
    }
    pvVar1 = operator_new__(in_RDX,(nothrow_t *)&std::nothrow);
    *(void **)(in_RDI + 8) = pvVar1;
    if (*(long *)(in_RDI + 8) == 0) {
      local_1 = false;
    }
    else {
      memcpy(*(void **)(in_RDI + 8),in_RSI,in_RDX);
      *(ulong *)(in_RDI + 0x30) = in_RDX;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool ContentEncoding::SetEncryptionID(const uint8_t* id, uint64_t length) {
  if (!id || length < 1)
    return false;

  delete[] enc_key_id_;

  enc_key_id_ =
      new (std::nothrow) uint8_t[static_cast<size_t>(length)];  // NOLINT
  if (!enc_key_id_)
    return false;

  memcpy(enc_key_id_, id, static_cast<size_t>(length));
  enc_key_id_length_ = length;

  return true;
}